

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void prepare_warp_horizontal_filter
               (uint8_t *ref,__m128i *tmp,int stride,int32_t ix4,int32_t iy4,int32_t sx4,int alpha,
               int beta,int p_height,int height,int i,int offset_bits_horiz,int reduce_bits_horiz)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  int unaff_EBX;
  undefined8 unaff_RBP;
  undefined4 in_R8D;
  undefined4 in_R9D;
  int unaff_R14D;
  undefined8 unaff_R15;
  int32_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  int in_stack_00000008;
  uint in_stack_0000000c;
  int in_stack_00000010;
  uint in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000028;
  int32_t in_stack_00000030;
  int in_stack_00000058;
  int in_stack_00000060;
  int32_t in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  
  if ((in_stack_00000008 == 0) && (in_stack_00000010 == 0)) {
    warp_horizontal_filter_alpha0_beta0
              ((uint8_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               (__m128i *)((ulong)in_stack_00000014 << 0x20),in_stack_0000000c,0,unaff_retaddr_00,
               unaff_retaddr,in_stack_00000030,sx4,ix4,(int)tmp,(int)ref,in_stack_00000058,
               in_stack_00000060);
  }
  else if ((in_stack_00000008 == 0) && (in_stack_00000010 != 0)) {
    warp_horizontal_filter_alpha0
              ((uint8_t *)((ulong)in_stack_0000000c << 0x20),
               (__m128i *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(int)((ulong)unaff_RBP >> 0x20),
               (int32_t)unaff_RBP,(int32_t)((ulong)unaff_R15 >> 0x20),(int32_t)unaff_R15,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,sx4,ix4,(int)tmp,(int)ref);
  }
  else if ((in_stack_00000008 == 0) || (in_stack_00000010 != 0)) {
    warp_horizontal_filter
              ((uint8_t *)CONCAT44(in_EDX,in_ECX),(__m128i *)CONCAT44(in_R8D,in_R9D),
               in_stack_ffffffffffffffbc,sx4,in_stack_ffffffffffffffb4,in_stack_00000030,unaff_EBX,
               unaff_R14D,(int32_t)unaff_R15,(int32_t)unaff_RBP,unaff_retaddr,in_stack_00000008,
               in_stack_00000010);
  }
  else {
    warp_horizontal_filter_beta0
              ((uint8_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               (__m128i *)((ulong)in_stack_00000014 << 0x20),in_stack_0000000c,in_stack_00000008,
               unaff_retaddr_00,unaff_retaddr,in_stack_00000030,sx4,ix4,(int)tmp,(int)ref,
               in_stack_00000058,in_stack_00000060);
  }
  return;
}

Assistant:

static inline void prepare_warp_horizontal_filter(
    const uint8_t *ref, __m128i *tmp, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const int offset_bits_horiz, const int reduce_bits_horiz) {
  if (alpha == 0 && beta == 0)
    warp_horizontal_filter_alpha0_beta0(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                        beta, p_height, height, i,
                                        offset_bits_horiz, reduce_bits_horiz);
  else if (alpha == 0 && beta != 0)
    warp_horizontal_filter_alpha0(ref, tmp, stride, ix4, iy4, sx4, alpha, beta,
                                  p_height, height, i, offset_bits_horiz,
                                  reduce_bits_horiz);
  else if (alpha != 0 && beta == 0)
    warp_horizontal_filter_beta0(ref, tmp, stride, ix4, iy4, sx4, alpha, beta,
                                 p_height, height, i, offset_bits_horiz,
                                 reduce_bits_horiz);
  else
    warp_horizontal_filter(ref, tmp, stride, ix4, iy4, sx4, alpha, beta,
                           p_height, height, i, offset_bits_horiz,
                           reduce_bits_horiz);
}